

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O1

void amrex::EB2::IndexSpace::push(IndexSpace *ispace)

{
  iterator iVar1;
  unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_> *puVar2;
  IndexSpace *in_RDI;
  long lVar3;
  IndexSpace *local_8;
  
  lVar3 = (long)DAT_00757a80._M_current - (long)m_instance >> 5;
  puVar2 = m_instance;
  if (0 < lVar3) {
    puVar2 = (unique_ptr<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_> *)
             ((long)&(m_instance->_M_t).
                     super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
                     .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl +
             ((long)DAT_00757a80._M_current - (long)m_instance & 0xffffffffffffffe0U));
    lVar3 = lVar3 + 1;
    iVar1._M_current = m_instance + 2;
    do {
      if (iVar1._M_current[-2]._M_t.
          super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
          .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl == in_RDI) {
        iVar1._M_current = iVar1._M_current + -2;
        goto LAB_00529dba;
      }
      if (iVar1._M_current[-1]._M_t.
          super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
          .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl == in_RDI) {
        iVar1._M_current = iVar1._M_current + -1;
        goto LAB_00529dba;
      }
      if (((iVar1._M_current)->_M_t).
          super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
          .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl == in_RDI)
      goto LAB_00529dba;
      if (iVar1._M_current[1]._M_t.
          super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
          .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl == in_RDI) {
        iVar1._M_current = iVar1._M_current + 1;
        goto LAB_00529dba;
      }
      lVar3 = lVar3 + -1;
      iVar1._M_current = iVar1._M_current + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)DAT_00757a80._M_current - (long)puVar2 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      iVar1._M_current = DAT_00757a80._M_current;
      if ((lVar3 != 3) ||
         (iVar1._M_current = puVar2,
         (puVar2->_M_t).
         super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
         .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl == in_RDI))
      goto LAB_00529dba;
      puVar2 = puVar2 + 1;
    }
    iVar1._M_current = puVar2;
    if ((puVar2->_M_t).
        super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>.
        _M_t.
        super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
        .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl == in_RDI)
    goto LAB_00529dba;
    puVar2 = puVar2 + 1;
  }
  iVar1._M_current = puVar2;
  if ((puVar2->_M_t).
      super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>.
      _M_t.
      super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
      .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl != in_RDI) {
    iVar1._M_current = DAT_00757a80._M_current;
  }
LAB_00529dba:
  if (iVar1._M_current == DAT_00757a80._M_current) {
    if (DAT_00757a80._M_current == DAT_00757a88) {
      std::
      vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>
      ::_M_realloc_insert<amrex::EB2::IndexSpace*&>
                ((vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>
                  *)&m_instance,DAT_00757a80,&local_8);
    }
    else {
      ((DAT_00757a80._M_current)->_M_t).
      super___uniq_ptr_impl<amrex::EB2::IndexSpace,_std::default_delete<amrex::EB2::IndexSpace>_>.
      _M_t.
      super__Tuple_impl<0UL,_amrex::EB2::IndexSpace_*,_std::default_delete<amrex::EB2::IndexSpace>_>
      .super__Head_base<0UL,_amrex::EB2::IndexSpace_*,_false>._M_head_impl = in_RDI;
      DAT_00757a80._M_current = DAT_00757a80._M_current + 1;
    }
  }
  else if (iVar1._M_current + 1 != DAT_00757a80._M_current) {
    std::_V2::
    __rotate<__gnu_cxx::__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>*,std::vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>>>
              (iVar1._M_current);
    return;
  }
  return;
}

Assistant:

void
IndexSpace::push (IndexSpace* ispace)
{
    auto r = std::find_if(m_instance.begin(), m_instance.end(),
                          [=] (const std::unique_ptr<IndexSpace>& x) -> bool
                          { return x.get() == ispace; });
    if (r == m_instance.end()) {
        m_instance.emplace_back(ispace);
    } else if (r+1 != m_instance.end()) {
        std::rotate(r, r+1, m_instance.end());
    }
}